

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isGatherOffsetsCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  Vec3 *prec_00;
  TexComparePrecision *sampler_00;
  bool bVar1;
  int iVar2;
  deInt32 dVar3;
  ConstPixelBufferAccess *texture_00;
  float fVar4;
  float fVar5;
  Vector<float,_3> local_68;
  int local_5c;
  int layer;
  int maxLayer;
  int minLayer;
  float maxZ;
  float minZ;
  float depthErr;
  Vec4 *result_local;
  IVec2 (*paIStack_38) [4];
  float cmpReference_local;
  IVec2 (*offsets_local) [4];
  Vec3 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  Texture2DArrayView *texture_local;
  
  _minZ = result;
  result_local._4_4_ = cmpReference;
  paIStack_38 = offsets;
  offsets_local = (IVec2 (*) [4])coord;
  coord_local = (Vec3 *)prec;
  prec_local = (TexComparePrecision *)sampler;
  sampler_local = (Sampler *)texture;
  fVar4 = Vector<float,_3>::z(coord);
  iVar2 = Vector<int,_3>::z((Vector<int,_3> *)coord_local);
  fVar4 = TexVerifierUtil::computeFloatingPointError(fVar4,iVar2);
  iVar2 = Vector<int,_3>::z((Vector<int,_3> *)(coord_local + 1));
  fVar5 = TexVerifierUtil::computeFixedPointError(iVar2);
  maxZ = fVar4 + fVar5;
  fVar4 = Vector<float,_3>::z((Vector<float,_3> *)offsets_local);
  minLayer = (int)(fVar4 - maxZ);
  fVar4 = Vector<float,_3>::z((Vector<float,_3> *)offsets_local);
  maxLayer = (int)(fVar4 + maxZ);
  dVar3 = deFloorFloatToInt32((float)minLayer + 0.5);
  iVar2 = Texture2DArrayView::getNumLayers((Texture2DArrayView *)sampler_local);
  layer = de::clamp<int>(dVar3,0,iVar2 + -1);
  dVar3 = deFloorFloatToInt32((float)maxLayer + 0.5);
  iVar2 = Texture2DArrayView::getNumLayers((Texture2DArrayView *)sampler_local);
  local_5c = de::clamp<int>(dVar3,0,iVar2 + -1);
  local_68.m_data[2] = (float)layer;
  while( true ) {
    if (local_5c < (int)local_68.m_data[2]) {
      return false;
    }
    texture_00 = Texture2DArrayView::getLevel((Texture2DArrayView *)sampler_local,0);
    sampler_00 = prec_local;
    prec_00 = coord_local;
    Vector<float,_3>::swizzle(&local_68,(int)offsets_local,0);
    bVar1 = isGatherOffsetsCompareResultValid
                      (texture_00,(Sampler *)sampler_00,(TexComparePrecision *)prec_00,
                       (Vec2 *)&local_68,(int)local_68.m_data[2],paIStack_38,result_local._4_4_,
                       _minZ);
    if (bVar1) break;
    local_68.m_data[2] = (float)((int)local_68.m_data[2] + 1);
  }
  return true;
}

Assistant:

bool isGatherOffsetsCompareResultValid (const Texture2DArrayView&	texture,
										const Sampler&				sampler,
										const TexComparePrecision&	prec,
										const Vec3&					coord,
										const IVec2					(&offsets)[4],
										float						cmpReference,
										const Vec4&					result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		if (isGatherOffsetsCompareResultValid(texture.getLevel(0), sampler, prec, coord.swizzle(0,1), layer, offsets, cmpReference, result))
			return true;
	}
	return false;
}